

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O2

void dit::loadImageRGBA8(TextureLevel *dst,Archive *archive,char *path)

{
  TextureLevel tmp;
  PixelBufferAccess local_70;
  ConstPixelBufferAccess local_48;
  
  tcu::TextureLevel::TextureLevel(&tmp);
  tcu::ImageIO::loadImage(&tmp,archive,path);
  local_70.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_70.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  tcu::TextureLevel::setStorage
            (dst,(TextureFormat *)&local_70,tmp.m_size.m_data[0],tmp.m_size.m_data[1],1);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_70,dst);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_48,&tmp);
  tcu::copy((EVP_PKEY_CTX *)&local_70,(EVP_PKEY_CTX *)&local_48);
  tcu::TextureLevel::~TextureLevel(&tmp);
  return;
}

Assistant:

static void loadImageRGBA8 (tcu::TextureLevel& dst, const tcu::Archive& archive, const char* path)
{
	tcu::TextureLevel tmp;
	tcu::ImageIO::loadImage(tmp, archive, path);

	dst.setStorage(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), tmp.getWidth(), tmp.getHeight());
	tcu::copy(dst, tmp);
}